

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O1

Sequence * __thiscall Sequence::operator=(Sequence *this,uint64_t seq)

{
  ulong uVar1;
  _Map_pointer ppiVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  
  ppiVar2 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  uVar3 = (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 2) +
          (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 2) +
          ((int)((ulong)((long)ppiVar2 -
                        (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppiVar2 == (_Map_pointer)0x0)) * 0x80;
  if (0 < (int)uVar3) {
    puVar4 = (uint *)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
    ppiVar2 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    lVar5 = (long)puVar4 -
            (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uVar6 = 0;
    do {
      uVar1 = (lVar5 >> 2) + uVar6;
      puVar8 = puVar4;
      if (0x7f < uVar1) {
        uVar7 = (uVar1 >> 7) + 0xfe00000000000000;
        if (0 < (long)uVar1) {
          uVar7 = uVar1 >> 7;
        }
        puVar8 = (uint *)(ppiVar2[uVar7] + uVar1 + uVar7 * -0x80);
      }
      *puVar8 = (uint)((seq >> (uVar6 & 0x3f) & 1) != 0);
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar6);
  }
  return this;
}

Assistant:

Sequence &Sequence::operator=(uint64_t seq) {
    auto n = size();
    for (auto i = 0; i < n; ++i) {
        m_bits[i] = (seq >> i) & 1;
    }
    return *this;
}